

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O2

void __thiscall OmegaOP::algoISOTONIC(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  OmegaOP *pOVar4;
  OmegaOP *pOVar5;
  double **ppdVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  Costs cost;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  OmegaOP *local_a0;
  ulong local_98;
  void *local_90;
  double local_88;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  double theV;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  double local_40;
  long local_38;
  
  uVar15 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar10 = this->nbStates;
  Costs::Costs(&cost);
  ppdVar6 = preprocessing(this,data);
  this->S12P = ppdVar6;
  local_50 = (ulong)((int)uVar15 + 1);
  uVar12 = local_50 * 4;
  local_a0 = this;
  local_60 = uVar15;
  pvVar7 = operator_new__(uVar12);
  local_90 = operator_new__(uVar12);
  pOVar4 = local_a0;
  theV = 0.0;
  local_78 = (ulong)(uVar10 - 1);
  local_58 = local_78 - 1;
  uVar14 = 0;
  local_b0 = 2;
  local_98 = (ulong)uVar10;
  local_48 = pvVar7;
  do {
    if ((uint)local_50 <= local_b0) {
      local_a0->pruning =
           ((double)uVar14 + (double)uVar14) /
           ((double)((int)local_60 - 1) *
           (double)(local_60 & 0xffffffff) *
           (double)(local_98 & 0xffffffff) * (double)(local_98 & 0xffffffff));
      operator_delete__(pvVar7);
      operator_delete__(local_90);
      return;
    }
    ppdVar6 = local_a0->Q;
    uVar12 = (ulong)(local_b0 - 1);
    uVar15 = 0;
    do {
      if (local_78 == uVar15) {
        iVar9 = (int)local_78;
        goto LAB_0010b563;
      }
      ppdVar1 = ppdVar6 + uVar15;
      lVar13 = uVar15 + 1;
      uVar15 = uVar15 + 1;
    } while (ppdVar6[lVar13][uVar12] <= (*ppdVar1)[uVar12] &&
             (*ppdVar1)[uVar12] != ppdVar6[lVar13][uVar12]);
    iVar9 = (int)uVar15 + -1;
LAB_0010b563:
    *(int *)((long)pvVar7 + uVar12 * 4) = iVar9;
    uVar15 = local_98;
    uVar11 = local_58;
    do {
      if (uVar11 == 0xffffffffffffffff) {
        uVar10 = 0;
        break;
      }
      lVar13 = uVar11 + 1;
      uVar8 = uVar11 & 0xffffffff;
      uVar10 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar10;
      uVar11 = uVar11 - 1;
    } while (ppdVar6[uVar8][uVar12] <= ppdVar6[lVar13][uVar12] &&
             ppdVar6[lVar13][uVar12] != ppdVar6[uVar8][uVar12]);
    *(uint *)((long)local_90 + uVar12 * 4) = uVar10;
    for (uVar12 = 0; uVar12 != local_98; uVar12 = uVar12 + 1) {
      local_a8 = 0;
      uVar15 = 1;
      local_88 = INFINITY;
      local_a4 = 0;
      local_70 = uVar12;
      while( true ) {
        pOVar5 = local_a0;
        local_ac = (uint)uVar15;
        uVar11 = (ulong)local_b0;
        if (local_b0 <= local_ac) break;
        if (local_ac < local_b0 - 1) {
          pdVar2 = *local_a0->S12P;
          pdVar3 = local_a0->S12P[2];
          theV = Costs::vhat(&cost,local_a0->states + uVar12,&local_ac,&local_b0,pdVar2 + uVar15,
                             pdVar2 + uVar11,pdVar3 + uVar15,pdVar3 + uVar11);
          local_7c = Costs::closestStateIndex(&cost,&theV,pOVar5->states,(uint)local_98);
          uVar15 = (ulong)local_ac;
          uVar12 = local_70;
        }
        else {
          local_7c = *(uint *)((long)pvVar7 + (ulong)(local_b0 - 1) * 4);
        }
        uVar8 = (ulong)*(uint *)((long)pvVar7 + uVar15 * 4);
        uVar11 = (ulong)local_7c;
        if (uVar12 < local_7c) {
          uVar11 = uVar12;
        }
        if (uVar8 <= uVar11) {
          uVar11 = uVar8;
        }
        lVar13 = uVar11 * 8;
        while( true ) {
          uVar10 = *(uint *)((long)local_90 + uVar15 * 4);
          if (uVar10 <= local_7c) {
            uVar10 = local_7c;
          }
          if ((uint)uVar12 < uVar10) {
            uVar10 = (uint)uVar12;
          }
          if (uVar10 + 1 <= uVar11) break;
          uVar14 = uVar14 + 1;
          local_40 = pOVar4->Q[uVar11][uVar15];
          ppdVar6 = pOVar4->S12P;
          uVar8 = (ulong)local_b0;
          local_38 = lVar13;
          dVar16 = Costs::slopeCost(&cost,(double *)((long)pOVar4->states + lVar13),
                                    pOVar4->states + uVar12,&local_ac,&local_b0,*ppdVar6 + uVar15,
                                    *ppdVar6 + uVar8,ppdVar6[1] + uVar15,ppdVar6[1] + uVar8,
                                    ppdVar6[2] + uVar15,ppdVar6[2] + uVar8);
          dVar16 = dVar16 + local_40 + pOVar4->penalty;
          uVar15 = (ulong)local_ac;
          if (dVar16 < local_88) {
            local_a4 = (uint)uVar11;
            local_88 = dVar16;
            local_a8 = local_ac;
          }
          uVar11 = uVar11 + 1;
          lVar13 = local_38 + 8;
          uVar12 = local_70;
        }
        uVar15 = (ulong)((int)uVar15 + 1);
        pvVar7 = local_48;
      }
      local_a0->Q[uVar12][uVar11] = local_88;
      local_a0->lastChpt[uVar12][uVar11] = local_a8;
      local_a0->lastIndState[uVar12][local_b0] = local_a4;
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

void OmegaOP::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
    {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
    {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) with add. constaint u <= v
        for(unsigned int u = std::min(std::min(u1[t],indexTheV), v); u < std::min(std::max(u2[t],indexTheV), v) + 1; u++) /////explore column of states
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}